

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O3

upb_Array *
upb_Array_DeepClone(upb_Array *array,upb_CType value_type,upb_MiniTable *sub,upb_Arena *arena)

{
  byte bVar1;
  size_t sVar2;
  _Bool _Var3;
  upb_Array *arr;
  size_t i;
  ulong uVar4;
  upb_MessageValue val;
  upb_MessageValue local_48;
  upb_MiniTable *local_38;
  
  sVar2 = array->size_dont_copy_me__upb_internal_use_only;
  bVar1 = _upb_CType_SizeLg2_dont_copy_me__upb_internal_use_only_size[value_type - kUpb_CType_Bool];
  uVar4 = (sVar2 << (bVar1 & 0x3f)) + 0x1f & 0xfffffffffffffff8;
  arr = (upb_Array *)arena->ptr_dont_copy_me__upb_internal_use_only;
  local_38 = sub;
  if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)arr) < uVar4) {
    arr = (upb_Array *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,uVar4);
  }
  else {
    if ((upb_Array *)
        ((ulong)((long)&arr->data_dont_copy_me__upb_internal_use_only + 7U) & 0xfffffffffffffff8) !=
        arr) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    arena->ptr_dont_copy_me__upb_internal_use_only =
         (char *)((long)&arr->data_dont_copy_me__upb_internal_use_only + uVar4);
  }
  if (arr == (upb_Array *)0x0) {
LAB_004e85d8:
    arr = (upb_Array *)0x0;
  }
  else {
    uVar4 = ((ulong)(uint)(int)(char)bVar1 - 1) + (ulong)(value_type - kUpb_CType_Bool == 0) |
            (ulong)(arr + 1);
    arr->data_dont_copy_me__upb_internal_use_only = uVar4;
    arr->size_dont_copy_me__upb_internal_use_only = 0;
    arr->capacity_dont_copy_me__upb_internal_use_only = sVar2;
    if ((uVar4 & 4) != 0) {
      __assert_fail("!upb_Array_IsFrozen(array)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x6c,
                    "_Bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
                   );
    }
    arr->size_dont_copy_me__upb_internal_use_only = sVar2;
    if (sVar2 != 0) {
      i = 0;
      do {
        local_48 = upb_Array_Get(array,i);
        _Var3 = upb_Clone_MessageValue(&local_48,value_type,local_38,arena);
        if (!_Var3) goto LAB_004e85d8;
        upb_Array_Set(arr,i,local_48);
        i = i + 1;
      } while (sVar2 != i);
    }
  }
  return arr;
}

Assistant:

upb_Array* upb_Array_DeepClone(const upb_Array* array, upb_CType value_type,
                               const upb_MiniTable* sub, upb_Arena* arena) {
  const size_t size = upb_Array_Size(array);
  const int lg2 = UPB_PRIVATE(_upb_CType_SizeLg2)(value_type);
  upb_Array* cloned_array = UPB_PRIVATE(_upb_Array_New)(arena, size, lg2);
  if (!cloned_array) {
    return NULL;
  }
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(cloned_array, size, arena)) {
    return NULL;
  }
  for (size_t i = 0; i < size; ++i) {
    upb_MessageValue val = upb_Array_Get(array, i);
    if (!upb_Clone_MessageValue(&val, value_type, sub, arena)) {
      return NULL;
    }
    upb_Array_Set(cloned_array, i, val);
  }
  return cloned_array;
}